

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this)

{
  Option *in_stack_00000038;
  InnerProduct_x86_avx *in_stack_00000040;
  
  create_pipeline(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}